

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O2

bool duckdb::IntegerDecimalCastOperation::
     HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,true>
               (IntegerDecimalCastData<unsigned_long> *state,int16_t exponent)

{
  StoreType *result;
  uint16_t uVar1;
  bool bVar2;
  uint64_t right;
  uint16_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t left;
  short sVar6;
  
  sVar6 = exponent;
  if (exponent < 0) {
    uVar4 = state->result;
    for (; (uVar4 != 0 && (exponent < 0)); exponent = exponent + 1) {
      state->decimal = uVar4 % 10;
      state->result = uVar4 / 10;
      uVar4 = uVar4 / 10;
    }
    state->decimal_digits = 1;
    goto LAB_0165bfe0;
  }
  while ((left = state->result, left != 0 && (0 < sVar6))) {
    bVar2 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                      (left,10,&state->result);
    sVar6 = sVar6 + -1;
    if (!bVar2) {
      return false;
    }
  }
  uVar4 = state->decimal;
  if (uVar4 == 0) goto LAB_0165bfe0;
  result = &state->decimal;
  uVar1 = state->decimal_digits;
  if ((short)(exponent - uVar1) < 0) {
    if ((ushort)(exponent - uVar1) < 0xffec) {
      *result = 0;
      right = 0;
      goto LAB_0165bfa2;
    }
    uVar5 = 1;
    for (uVar3 = exponent; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      uVar5 = uVar5 * 10;
    }
    right = uVar4 / uVar5;
    uVar4 = uVar4 % uVar5;
    *result = right;
  }
  else {
    sVar6 = (exponent - uVar1) + 1;
    while (sVar6 = sVar6 + -1, 0 < sVar6) {
      bVar2 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                        (*result,10,result);
      if (!bVar2) {
        return false;
      }
    }
    uVar1 = state->decimal_digits;
    left = state->result;
    right = state->decimal;
LAB_0165bfa2:
    uVar4 = 0;
  }
  state->decimal_digits = uVar1 - exponent;
  bVar2 = TrySubtractOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (left,right,&state->result);
  if (!bVar2) {
    return false;
  }
  *result = uVar4;
LAB_0165bfe0:
  bVar2 = Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>(state);
  return bVar2;
}

Assistant:

static bool HandleExponent(T &state, int16_t exponent) {
		using store_t = typename T::StoreType;

		int16_t e = exponent;
		// Negative Exponent
		if (e < 0) {
			while (state.result != 0 && e++ < 0) {
				state.decimal = state.result % 10;
				state.result /= 10;
			}
			if (state.decimal < 0) {
				state.decimal = -state.decimal;
			}
			state.decimal_digits = 1;
			return Finalize<T, NEGATIVE>(state);
		}

		// Positive Exponent
		while (state.result != 0 && e-- > 0) {
			if (!TryMultiplyOperator::Operation(state.result, (store_t)10, state.result)) {
				return false;
			}
		}

		if (state.decimal == 0) {
			return Finalize<T, NEGATIVE>(state);
		}

		// Handle decimals
		e = UnsafeNumericCast<int16_t>(exponent - state.decimal_digits);
		store_t remainder = 0;
		if (e < 0) {
			if (static_cast<uint16_t>(-e) <= NumericLimits<store_t>::Digits()) {
				store_t power = 1;
				while (e++ < 0) {
					power *= 10;
				}
				remainder = state.decimal % power;
				state.decimal /= power;
			} else {
				state.decimal = 0;
			}
		} else {
			while (e-- > 0) {
				if (!TryMultiplyOperator::Operation(state.decimal, (store_t)10, state.decimal)) {
					return false;
				}
			}
		}

		state.decimal_digits -= exponent;

		if (NEGATIVE) {
			if (!TrySubtractOperator::Operation(state.result, state.decimal, state.result)) {
				return false;
			}
		} else if (!TryAddOperator::Operation(state.result, state.decimal, state.result)) {
			return false;
		}
		state.decimal = remainder;
		return Finalize<T, NEGATIVE>(state);
	}